

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeesPdu.cpp
# Opt level: O0

void __thiscall DIS::SeesPdu::~SeesPdu(SeesPdu *this)

{
  SeesPdu *this_local;
  
  (this->super_DistributedEmissionsFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__SeesPdu_00268de8;
  std::vector<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>::clear
            (&this->_propulsionSystemData);
  std::vector<DIS::VectoringNozzleSystem,_std::allocator<DIS::VectoringNozzleSystem>_>::clear
            (&this->_vectoringSystemData);
  std::vector<DIS::VectoringNozzleSystem,_std::allocator<DIS::VectoringNozzleSystem>_>::~vector
            (&this->_vectoringSystemData);
  std::vector<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>::~vector
            (&this->_propulsionSystemData);
  EntityID::~EntityID(&this->_orginatingEntityID);
  DistributedEmissionsFamilyPdu::~DistributedEmissionsFamilyPdu
            (&this->super_DistributedEmissionsFamilyPdu);
  return;
}

Assistant:

SeesPdu::~SeesPdu()
{
    _propulsionSystemData.clear();
    _vectoringSystemData.clear();
}